

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

Abc_Obj_t * Abc_NtkDupObj(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj,int fCopyName)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  void **ppvVar4;
  char *pName;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar5;
  DdNode *n;
  int *piVar6;
  Abc_Obj_t *pAVar7;
  
  pObj_00 = Abc_NtkCreateObj(pNtkNew,*(Abc_ObjType_t *)&pObj->field_0x14 &
                                     (ABC_OBJ_LATCH|ABC_OBJ_NODE));
  if (fCopyName != 0) {
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    pAVar7 = pObj;
    if ((uVar3 == 5) || (uVar3 == 2)) {
      if (pNtkNew->ntkType != ABC_NTK_NETLIST) {
        if (pObj->pNtk->ntkType == ABC_NTK_NETLIST) {
          ppvVar4 = pObj->pNtk->vObjs->pArray;
          piVar6 = (pObj->vFanouts).pArray;
LAB_006bb5e3:
          pAVar7 = (Abc_Obj_t *)ppvVar4[*piVar6];
        }
        goto LAB_006bb651;
      }
    }
    else if (uVar3 - 5 < 0xfffffffe) {
      if ((((*(uint *)&pObj->field_0x14 & 0xe) == 8) || (uVar3 == 10)) || (uVar3 == 6)) {
LAB_006bb651:
        pName = Abc_ObjName(pAVar7);
        Abc_ObjAssignName(pObj_00,pName,(char *)0x0);
      }
    }
    else if (pNtkNew->ntkType != ABC_NTK_NETLIST) {
      pAVar1 = pObj->pNtk;
      if (uVar3 == 3) {
        if (pAVar1->ntkType == ABC_NTK_NETLIST) {
          ppvVar4 = pAVar1->vObjs->pArray;
          piVar6 = (pObj->vFanins).pArray;
          goto LAB_006bb5e3;
        }
      }
      else if ((*(uint *)((long)pAVar1->vObjs->pArray[*(pObj->vFanouts).pArray] + 0x14) & 0xf) != 8)
      {
        __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                      ,0x16b,"Abc_Obj_t *Abc_NtkDupObj(Abc_Ntk_t *, Abc_Obj_t *, int)");
      }
      goto LAB_006bb651;
    }
  }
  uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar3 == 8) {
    aVar5 = pObj->field_5;
    goto LAB_006bb6b6;
  }
  if (uVar3 != 7) goto LAB_006bb6ba;
  pAVar1 = pObj->pNtk;
  if ((pNtkNew->ntkFunc != pAVar1->ntkFunc) || (pNtkNew->ntkType == ABC_NTK_STRASH))
  goto LAB_006bb6ba;
  switch(pNtkNew->ntkFunc) {
  case ABC_FUNC_SOP:
  case ABC_FUNC_BLIFMV:
    aVar5.pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(pObj->field_5).pData);
    break;
  case ABC_FUNC_BDD:
    n = Cudd_bddTransfer((DdManager *)pAVar1->pManFunc,(DdManager *)pNtkNew->pManFunc,
                         (DdNode *)(pObj->field_5).pData);
    (pObj_00->field_5).pData = n;
    Cudd_Ref(n);
    goto LAB_006bb6ba;
  case ABC_FUNC_AIG:
    aVar5.pData = Hop_Transfer((Hop_Man_t *)pAVar1->pManFunc,(Hop_Man_t *)pNtkNew->pManFunc,
                               (Hop_Obj_t *)(pObj->field_5).pData,(pObj->vFanins).nSize);
    break;
  case ABC_FUNC_MAP:
    pvVar2 = (pObj->field_5).pData;
    (pObj_00->field_5).pData = pvVar2;
    pNtkNew->nBarBufs2 = pNtkNew->nBarBufs2 + (uint)(pvVar2 == (void *)0x0);
    goto LAB_006bb6ba;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x184,"Abc_Obj_t *Abc_NtkDupObj(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
LAB_006bb6b6:
  pObj_00->field_5 = aVar5;
LAB_006bb6ba:
  (pObj->field_6).pCopy = pObj_00;
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkDupObj( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, int fCopyName )
{
    Abc_Obj_t * pObjNew;
    // create the new object
    pObjNew = Abc_NtkCreateObj( pNtkNew, (Abc_ObjType_t)pObj->Type );
    // transfer names of the terminal objects
    if ( fCopyName )
    {
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( !Abc_NtkIsNetlist(pNtkNew) )
                Abc_ObjAssignName( pObjNew, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
        }
        else if ( Abc_ObjIsCo(pObj) )
        {
            if ( !Abc_NtkIsNetlist(pNtkNew) )
            {
                if ( Abc_ObjIsPo(pObj) )
                    Abc_ObjAssignName( pObjNew, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
                else
                {
                    assert( Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) );
                    Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
                }
            }
        }
        else if ( Abc_ObjIsBox(pObj) || Abc_ObjIsNet(pObj) )
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
    }
    // copy functionality/names
    if ( Abc_ObjIsNode(pObj) ) // copy the function if functionality is compatible
    {
        if ( pNtkNew->ntkFunc == pObj->pNtk->ntkFunc ) 
        {
            if ( Abc_NtkIsStrash(pNtkNew) ) 
            {}
            else if ( Abc_NtkHasSop(pNtkNew) || Abc_NtkHasBlifMv(pNtkNew) )
                pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, (char *)pObj->pData );
#ifdef ABC_USE_CUDD
            else if ( Abc_NtkHasBdd(pNtkNew) )
                pObjNew->pData = Cudd_bddTransfer((DdManager *)pObj->pNtk->pManFunc, (DdManager *)pNtkNew->pManFunc, (DdNode *)pObj->pData), Cudd_Ref((DdNode *)pObjNew->pData);
#endif
            else if ( Abc_NtkHasAig(pNtkNew) )
                pObjNew->pData = Hop_Transfer((Hop_Man_t *)pObj->pNtk->pManFunc, (Hop_Man_t *)pNtkNew->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj));
            else if ( Abc_NtkHasMapping(pNtkNew) )
                pObjNew->pData = pObj->pData, pNtkNew->nBarBufs2 += !pObj->pData;
            else assert( 0 );
        }
    }
    else if ( Abc_ObjIsNet(pObj) ) // copy the name
    {
    }
    else if ( Abc_ObjIsLatch(pObj) ) // copy the reset value
        pObjNew->pData = pObj->pData;
    // transfer HAIG
//    pObjNew->pEquiv = pObj->pEquiv;
    // remember the new node in the old node
    pObj->pCopy = pObjNew;
    return pObjNew;
}